

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluObjectWrapper.cpp
# Opt level: O0

void __thiscall
glu::ObjectVector::ObjectVector
          (ObjectVector *this,Functions *gl,ObjectTraits *traits,size_t numObjects)

{
  size_t numObjects_local;
  ObjectTraits *traits_local;
  Functions *gl_local;
  ObjectVector *this_local;
  
  this->m_gl = gl;
  this->m_traits = traits;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_objects);
  if (numObjects != 0) {
    resize(this,numObjects);
  }
  return;
}

Assistant:

ObjectVector::ObjectVector (const glw::Functions& gl, const ObjectTraits& traits, size_t numObjects)
	: m_gl		(gl)
	, m_traits	(traits)
{
	if (numObjects > 0)
		resize(numObjects);
}